

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O0

void __thiscall xLearn::Solver::start_train_work(Solver *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined8 uVar4;
  long in_RDI;
  float fVar5;
  Timer timer_1;
  bool in_stack_00000166;
  bool in_stack_00000167;
  Metric *in_stack_00000168;
  Timer timer;
  int in_stack_00000184;
  vector<xLearn::Reader_*,_std::allocator<xLearn::Reader_*>_> *in_stack_00000188;
  Trainer *in_stack_00000190;
  int in_stack_000001a8;
  Trainer trainer;
  bool save_txt_model;
  bool save_model;
  bool quiet;
  int stop_window;
  bool early_stop;
  int epoch;
  undefined1 in_stack_fffffffffffffdaf;
  undefined4 in_stack_fffffffffffffdb0;
  undefined4 uVar6;
  undefined4 in_stack_fffffffffffffdb4;
  Timer *in_stack_fffffffffffffdc0;
  allocator *paVar7;
  Trainer *this_00;
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [8];
  Trainer *in_stack_fffffffffffffe40;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [24];
  string local_150 [32];
  string local_130 [39];
  allocator local_109;
  string local_108 [55];
  allocator local_d1;
  string local_d0 [39];
  allocator<char> local_a9;
  string *in_stack_ffffffffffffff58;
  Trainer *in_stack_ffffffffffffff60;
  
  uVar6 = *(undefined4 *)(in_RDI + 0x1f8);
  bVar1 = true;
  bVar2 = true;
  iVar3 = std::__cxx11::string::compare((char *)(in_RDI + 0x140));
  if ((iVar3 == 0) || ((*(byte *)(in_RDI + 0x1ee) & 1) != 0)) {
    bVar1 = false;
  }
  iVar3 = std::__cxx11::string::compare((char *)(in_RDI + 0x180));
  if ((iVar3 == 0) || ((*(byte *)(in_RDI + 0x1ee) & 1) != 0)) {
    bVar2 = false;
  }
  Trainer::Trainer((Trainer *)CONCAT44(in_stack_fffffffffffffdb4,in_stack_fffffffffffffdb0));
  Trainer::Initialize(in_stack_00000190,in_stack_00000188,in_stack_00000184,
                      (Model *)timer.duration.__r,(Loss *)timer.begin.__d.__r,in_stack_00000168,
                      in_stack_00000167,in_stack_000001a8,in_stack_00000166);
  this_00 = (Trainer *)&local_a9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffff58,"Start to train ...",(allocator *)this_00);
  Color::print_action((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff58);
  std::allocator<char>::~allocator(&local_a9);
  if ((*(byte *)(in_RDI + 0x1ee) & 1) == 0) {
    Trainer::Train(this_00);
    if (bVar1) {
      Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      Timer::tic((Timer *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_108,"Start to save model ...",&local_109);
      Color::print_action((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      std::__cxx11::string::~string(local_108);
      std::allocator<char>::~allocator((allocator<char> *)&local_109);
      Trainer::SaveModel(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      uVar4 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_130,"Model file: %s",uVar4);
      Color::print_info((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6),
                        (bool)in_stack_fffffffffffffdaf);
      std::__cxx11::string::~string(local_130);
      fVar5 = Timer::toc(in_stack_fffffffffffffdc0);
      StringPrintf_abi_cxx11_
                ((char *)(double)fVar5,local_150,"Time cost for saving model: %.2f (sec)");
      Color::print_info((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6),
                        (bool)in_stack_fffffffffffffdaf);
      std::__cxx11::string::~string(local_150);
    }
    if (bVar2) {
      Timer::Timer((Timer *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      Timer::tic((Timer *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_180,"Start to save txt model ...",&local_181);
      Color::print_action((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
      std::__cxx11::string::~string(local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      Trainer::SaveTxtModel(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      uVar4 = std::__cxx11::string::c_str();
      StringPrintf_abi_cxx11_((char *)local_1a8,"TXT Model file: %s",uVar4);
      Color::print_info((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6),
                        (bool)in_stack_fffffffffffffdaf);
      std::__cxx11::string::~string(local_1a8);
      fVar5 = Timer::toc(in_stack_fffffffffffffdc0);
      StringPrintf_abi_cxx11_
                ((char *)(double)fVar5,local_1c8,"Time cost for saving txt model: %.2f (sec)");
      Color::print_info((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6),
                        (bool)in_stack_fffffffffffffdaf);
      std::__cxx11::string::~string(local_1c8);
    }
    paVar7 = &local_1e9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1e8,"Finish training",paVar7);
    Color::print_action((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
    std::__cxx11::string::~string(local_1e8);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
  }
  else {
    Trainer::CVTrain(in_stack_fffffffffffffe40);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_d0,"Finish Cross-Validation",&local_d1);
    Color::print_action((string *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
    std::__cxx11::string::~string(local_d0);
    std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  }
  Trainer::~Trainer((Trainer *)CONCAT44(in_stack_fffffffffffffdb4,uVar6));
  return;
}

Assistant:

void Solver::start_train_work() {
  int epoch = hyper_param_.num_epoch;
  bool early_stop = hyper_param_.early_stop &&
                   !hyper_param_.cross_validation;
  int stop_window = hyper_param_.stop_window;
  bool quiet = hyper_param_.quiet &&
              !hyper_param_.cross_validation;
  bool save_model = true;
  bool save_txt_model = true;
  if (hyper_param_.model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_model = false;
  }
  if (hyper_param_.txt_model_file.compare("none") == 0 ||
      hyper_param_.cross_validation) {
    save_txt_model = false;
  }
  Trainer trainer;
  trainer.Initialize(reader_,  /* Reader list */
                     epoch,
                     model_,
                     loss_,
                     metric_,
                     early_stop,
                     stop_window,
                     quiet);
  Color::print_action("Start to train ...");
/******************************************************************************
 * Training under cross-validation                                            *
 ******************************************************************************/
  if (hyper_param_.cross_validation) {
    trainer.CVTrain();
    Color::print_action("Finish Cross-Validation");
  } 
/******************************************************************************
 * Original training without cross-validation                                 *
 ******************************************************************************/
  else {
    // The training process
    trainer.Train();
    // Save binary model
    if (save_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save model ...");
      trainer.SaveModel(hyper_param_.model_file);
      Color::print_info(
        StringPrintf("Model file: %s", hyper_param_.model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving model: %.2f (sec)", timer.toc())
      );
    }
    // Save TXT model 
    if (save_txt_model) {
      Timer timer;
      timer.tic();
      Color::print_action("Start to save txt model ...");
      trainer.SaveTxtModel(hyper_param_.txt_model_file);
      Color::print_info(
        StringPrintf("TXT Model file: %s", hyper_param_.txt_model_file.c_str())
      );
      Color::print_info(
        StringPrintf("Time cost for saving txt model: %.2f (sec)", timer.toc())
      );
    }
    Color::print_action("Finish training");
  }
}